

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall
bloom_tests::merkle_block_3_and_serialize::test_method(merkle_block_3_and_serialize *this)

{
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  left_begin;
  bool bVar1;
  undefined1 uVar2;
  byte *right_begin;
  lazy_ostream *right_end;
  size_type sVar3;
  long in_FS_OFFSET;
  uint i;
  DataStream merkleStream;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  DataStream stream;
  CBloomFilter filter;
  array<std::byte,_119UL> expected;
  CMerkleBlock merkleBlock;
  CBlock block;
  CMerkleBlock *in_stack_fffffffffffff6c8;
  char *in_stack_fffffffffffff6d0;
  char *in_stack_fffffffffffff6d8;
  DataStream *in_stack_fffffffffffff6e0;
  CBlock *in_stack_fffffffffffff6e8;
  const_string *in_stack_fffffffffffff6f0;
  size_t in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff700;
  undefined1 in_stack_fffffffffffff707;
  lazy_ostream *in_stack_fffffffffffff708;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff710;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffff718;
  CPartialMerkleTree *in_stack_fffffffffffff720;
  CBloomFilter *in_stack_fffffffffffff728;
  equal_coll_impl *this_00;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  left_end;
  undefined7 in_stack_fffffffffffff7c8;
  uint local_7c0;
  lazy_ostream local_798 [2];
  assertion_result local_770 [2];
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  const_string local_710 [2];
  lazy_ostream local_6f0 [2];
  assertion_result local_6d0 [2];
  const_string local_698 [2];
  lazy_ostream local_678 [2];
  assertion_result local_658 [2];
  const_string local_620 [2];
  lazy_ostream local_600 [2];
  assertion_result local_5e0 [4];
  const_string local_578 [2];
  lazy_ostream local_558 [2];
  assertion_result local_538 [2];
  const_string local_500 [2];
  lazy_ostream local_4e0 [2];
  assertion_result local_4c0 [2];
  const_string local_488 [2];
  lazy_ostream local_468 [2];
  assertion_result local_448 [2];
  const_string local_410 [2];
  lazy_ostream local_3f0 [2];
  assertion_result local_3d0 [3];
  ParamsWrapper<TransactionSerParams,_CBlock> local_388;
  undefined1 local_31f [151];
  undefined1 local_288;
  undefined1 local_287;
  undefined1 local_286;
  undefined1 local_285;
  undefined1 local_284;
  undefined1 local_283;
  undefined1 local_282;
  undefined1 local_281;
  undefined1 local_280;
  undefined1 local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  undefined1 local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_fffffffffffff6e8);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<433UL>___1,_0,_0,_0,_121,_205,_168,_86,_177,_67,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,216ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff6d8,
             (array<std::byte,_216UL> *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  sp.m_size = in_stack_fffffffffffff6f8;
  sp.m_data = (byte *)in_stack_fffffffffffff6f0;
  DataStream::DataStream(in_stack_fffffffffffff6e0,sp);
  local_388 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffff6d8,
                         (CBlock *)in_stack_fffffffffffff6d0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff6d8,
             (ParamsWrapper<TransactionSerParams,_CBlock> *)in_stack_fffffffffffff6d0);
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffff728,(uint)((ulong)in_stack_fffffffffffff720 >> 0x20),
             (double)in_stack_fffffffffffff718,(uint)((ulong)in_stack_fffffffffffff710 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffff710 >> 0x18));
  local_151 = 99;
  local_152 = 0x19;
  local_153 = 0x4f;
  local_154 = 0x18;
  local_155 = 0xbe;
  local_156 = 10;
  local_157 = 0xf6;
  local_158 = 0x3f;
  local_159 = 0x2c;
  local_15a = 0x6b;
  local_15b = 0xc9;
  local_15c = 0xdc;
  local_15d = 0xf;
  local_15e = 0x77;
  local_15f = 0x7c;
  local_160 = 0xbe;
  local_161 = 0xfe;
  local_162 = 0xd3;
  local_163 = 0xd9;
  local_164 = 0x41;
  local_165 = 0x5c;
  local_166 = 0x4a;
  local_167 = 0xf8;
  local_168 = 0x3f;
  local_169 = 0x3e;
  local_16a = 0xe3;
  local_16b = 0xa3;
  local_16c = 0xd6;
  local_16d = 0x69;
  local_16e = 0xc0;
  local_16f = 0xc;
  local_170 = 0xb5;
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff6d8,
             (uint256 *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  vKey.m_size = in_stack_fffffffffffff6f8;
  vKey.m_data = (uchar *)in_stack_fffffffffffff6f0;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffff6d8,vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)in_stack_fffffffffffff6d8,(CBlock *)in_stack_fffffffffffff6d0,
             (CBloomFilter *)in_stack_fffffffffffff6c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    CBlockHeader::GetHash(&in_stack_fffffffffffff6e8->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_fffffffffffff6e8->super_CBlockHeader);
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff6d8,
                 (base_blob<256U> *)in_stack_fffffffffffff6d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d0,local_3f0,local_410,0x154,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_448,local_468,local_488,0x156,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff6d8,(size_type)in_stack_fffffffffffff6d0);
    local_269 = 99;
    local_26a = 0x19;
    local_26b = 0x4f;
    local_26c = 0x18;
    local_26d = 0xbe;
    local_26e = 10;
    local_26f = 0xf6;
    local_270 = 0x3f;
    local_271 = 0x2c;
    local_272 = 0x6b;
    local_273 = 0xc9;
    local_274 = 0xdc;
    local_275 = 0xf;
    local_276 = 0x77;
    local_277 = 0x7c;
    local_278 = 0xbe;
    local_279 = 0xfe;
    local_27a = 0xd3;
    local_27b = 0xd9;
    local_27c = 0x41;
    local_27d = 0x5c;
    local_27e = 0x4a;
    local_27f = 0xf8;
    local_280 = 0x3f;
    local_281 = 0x3e;
    local_282 = 0xe3;
    local_283 = 0xa3;
    local_284 = 0xd6;
    local_285 = 0x69;
    local_286 = 0xc0;
    local_287 = 0xc;
    local_288 = 0xb5;
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff6d8,
                 (base_blob<256U> *)in_stack_fffffffffffff6d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4c0,local_4e0,local_500,0x158,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    left_end._M_current = (byte *)boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_fffffffffffff6d8,(size_type)in_stack_fffffffffffff6d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_538,local_558,local_578,0x159,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff6c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff6c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    CPartialMerkleTree::ExtractMatches
              (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
    ::operator==((base_blob<256U> *)in_stack_fffffffffffff6d8,
                 (base_blob<256U> *)in_stack_fffffffffffff6d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e0,local_600,local_620,0x15d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    right_begin = (byte *)std::vector<uint256,_std::allocator<uint256>_>::size
                                    ((vector<uint256,_std::allocator<uint256>_> *)
                                     in_stack_fffffffffffff6c8);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff6d8,
               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    right_end = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_658,local_678,local_698,0x15e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_7c0 = 0;
  while( true ) {
    sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff6c8);
    if (sVar3 <= local_7c0) break;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff708,
                 (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                 in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff6d8,
                 (size_type)in_stack_fffffffffffff6d0);
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)in_stack_fffffffffffff6d8,(size_type)in_stack_fffffffffffff6d0);
      ::operator==((base_blob<256U> *)in_stack_fffffffffffff6d8,
                   (base_blob<256U> *)in_stack_fffffffffffff6d0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff6d8,
                 SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff6d0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                 (unsigned_long)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6c8 = (CMerkleBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6d0,local_6f0,local_710,0x160,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff6c8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff6c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_7c0 = local_7c0 + 1;
  }
  local_728 = 0;
  uStack_720 = 0;
  local_738 = 0;
  uStack_730 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff6c8);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff6d8,(CMerkleBlock *)in_stack_fffffffffffff6d0);
  memcpy(local_31f,&DAT_01bc7874,0x77);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff708,
               (const_string *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
    DataStream::begin((DataStream *)in_stack_fffffffffffff6d8);
    DataStream::end((DataStream *)in_stack_fffffffffffff6d0);
    std::array<std::byte,_119UL>::begin((array<std::byte,_119UL> *)in_stack_fffffffffffff6c8);
    std::array<std::byte,_119UL>::end((array<std::byte,_119UL> *)in_stack_fffffffffffff6c8);
    left_begin._M_current._7_1_ = uVar2;
    left_begin._M_current._0_7_ = in_stack_fffffffffffff7c8;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (this_00,left_begin,left_end,right_begin,(byte *)right_end);
    in_stack_fffffffffffff708 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6d0,(char (*) [1])in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6d8 = "merkleStream.end()";
    in_stack_fffffffffffff6d0 = "merkleStream.begin()";
    in_stack_fffffffffffff6c8 = (CMerkleBlock *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_798,(const_string *)&stack0xfffffffffffff858,0x166,CHECK,
               CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff707 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff707);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff6c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff6d8);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff6d8);
  CMerkleBlock::~CMerkleBlock(in_stack_fffffffffffff6c8);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_fffffffffffff6c8);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff6c8);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff6c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_3_and_serialize)
{
    // Random real block (000000000000dab0130bbcc991d3d7ae6b81aa6f50a798888dfe62337458dc45)
    // With one tx
    CBlock block;
    DataStream stream{
        "0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630101000000010000000000000000000000000000000000000000000000000000000000000000ffffffff08044c86041b020a02ffffffff0100f2052a01000000434104ecd3229b0571c3be876feaac0442a9f13c5a572742927af1dc623353ecf8c202225f64868137a18cdd85cbbb4c74fbccfd4f49639cf1bdc94a5672bb15ad5d4cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the only transaction
    filter.insert(uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    DataStream merkleStream{};
    merkleStream << merkleBlock;

    constexpr auto expected{"0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630100000001b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f19630101"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(merkleStream.begin(), merkleStream.end(), expected.begin(), expected.end());
}